

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerIteration.cpp
# Opt level: O3

EigenAnswer * RealValues(EigenAnswer *__return_storage_ptr__,Vector *x1,Vector *x2)

{
  double dVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  pdVar2 = (x2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar3 = (long)(x2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar2;
  if (lVar3 == 0) {
    dVar5 = 0.0;
  }
  else {
    lVar3 = lVar3 >> 3;
    lVar4 = 0;
    dVar6 = 0.0;
    do {
      dVar1 = (x1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar4];
      if (((dVar1 != 0.0) || (dVar5 = dVar6, NAN(dVar1))) &&
         (dVar5 = pdVar2[lVar4] / dVar1, dVar5 <= dVar6)) {
        dVar5 = dVar6;
      }
      lVar4 = lVar4 + 1;
      dVar6 = dVar5;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  std::vector<double,_std::allocator<double>_>::vector(&__return_storage_ptr__->vector,x2);
  __return_storage_ptr__->value = dVar5;
  return __return_storage_ptr__;
}

Assistant:

EigenAnswer RealValues(const Vector &x1, const Vector &x2)
{
    const Vector &ans = x2;
    double value = 0;

    // average?
    for (int i = 0; i < ans.size(); ++i)
    {
        if (x1[i] != 0)
        {
            value = std::max(value, x2[i] / x1[i]);
        }
    }

    return {.vector = ans, .value = value};
}